

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this,TestCaseInfo *other)

{
  TestCaseInfo *other_local;
  TestCaseInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  std::__cxx11::string::string((string *)&this->className,(string *)&other->className);
  std::__cxx11::string::string((string *)&this->description,(string *)&other->description);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->tags,&other->tags);
  std::__cxx11::string::string((string *)&this->tagsAsString,(string *)&other->tagsAsString);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,&other->lineInfo);
  this->isHidden = (bool)(other->isHidden & 1);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( TestCaseInfo const& other )
    :   name( other.name ),
        className( other.className ),
        description( other.description ),
        tags( other.tags ),
        tagsAsString( other.tagsAsString ),
        lineInfo( other.lineInfo ),
        isHidden( other.isHidden )
    {}